

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O1

size_t JEBDebug::internal::print_hex_numbers
                 (ostream *stream,void *data,size_t num_bytes,size_t num_numbers)

{
  long lVar1;
  ostream oVar2;
  undefined4 in_EAX;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  undefined4 uStack_38;
  uint local_34;
  
  lVar5 = *(long *)stream;
  lVar1 = *(long *)(lVar5 + -0x18);
  _uStack_38 = CONCAT44(*(uint *)(stream + lVar1 + 0x18),in_EAX);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffffb5 | 8;
  lVar5 = *(long *)(lVar5 + -0x18);
  poVar3 = stream + lVar5;
  if (stream[lVar5 + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar3);
    poVar3[0xe0] = oVar2;
    poVar3[0xe1] = (ostream)0x1;
  }
  uStack_38._0_3_ = CONCAT12(poVar3[0xe0],(undefined2)uStack_38);
  poVar3[0xe0] = (ostream)0x30;
  if (num_numbers < num_bytes) {
    num_bytes = num_numbers;
  }
  sVar4 = 0;
  if (num_bytes != 0) {
    do {
      uStack_38 = CONCAT13(0x20,(undefined3)uStack_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(char *)((long)&uStack_38 + 3),1);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      sVar4 = sVar4 + 1;
    } while (num_bytes != sVar4);
  }
  lVar5 = num_numbers - sVar4;
  if (sVar4 <= num_numbers && lVar5 != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"   ",3);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  poVar3 = stream + *(long *)(*(long *)stream + -0x18);
  if (stream[*(long *)(*(long *)stream + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar3);
    poVar3[0xe0] = oVar2;
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = uStack_38._2_1_;
  *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = local_34;
  return num_bytes;
}

Assistant:

inline size_t print_hex_numbers(std::ostream& stream,
                                        const void* data, size_t num_bytes,
                                        size_t num_numbers)
        {
            auto flags = stream.setf(std::ios::hex, std::ios::basefield);
            auto fill = stream.fill('0');
            size_t i = 0;
            auto n = std::min(num_bytes, num_numbers);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
                stream << ' ' << std::setw(2) << unsigned(cdata[i]);
            for (; i < num_numbers; ++i)
                stream << "   ";
            stream.fill(fill);
            stream.flags(flags);
            return n;
        }